

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BasicBlock * __thiscall FlowGraph::SetBlockTargetAndLoopFlag(FlowGraph *this,LabelInstr *labelInstr)

{
  BasicBlock *local_20;
  BasicBlock *blockTarget;
  LabelInstr *labelInstr_local;
  FlowGraph *this_local;
  
  local_20 = IR::LabelInstr::GetBasicBlock(labelInstr);
  if (local_20 == (BasicBlock *)0x0) {
    local_20 = BasicBlock::New(this);
    IR::LabelInstr::SetBasicBlock(labelInstr,local_20);
  }
  if ((labelInstr->field_0x78 & 1) != 0) {
    *(ushort *)&local_20->field_0x18 = *(ushort *)&local_20->field_0x18 & 0xfffb | 4;
    this->hasLoop = true;
  }
  return local_20;
}

Assistant:

BasicBlock *
FlowGraph::SetBlockTargetAndLoopFlag(IR::LabelInstr * labelInstr)
{
    BasicBlock * blockTarget = nullptr;
    blockTarget = labelInstr->GetBasicBlock();

    if (blockTarget == nullptr)
    {
        blockTarget = BasicBlock::New(this);
        labelInstr->SetBasicBlock(blockTarget);
    }
    if (labelInstr->m_isLoopTop)
    {
        blockTarget->isLoopHeader = true;
        this->hasLoop = true;
    }

    return blockTarget;
}